

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daxpy.c
# Opt level: O3

void daxpy_(integer *n,doublereal *da,doublereal *dx,integer *incx,doublereal *dy,integer *incy)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  uVar2 = *n;
  uVar3 = (ulong)uVar2;
  if ((0 < (int)uVar2) && ((*da != 0.0 || (NAN(*da))))) {
    iVar1 = *incx;
    if ((long)iVar1 == 1) {
      iVar8 = *incy;
      if (iVar8 == 1) {
        if ((uVar2 & 3) != 0) {
          uVar6 = 0;
          do {
            dy[uVar6] = *da * dx[uVar6] + dy[uVar6];
            uVar6 = uVar6 + 1;
          } while ((uVar2 & 3) != uVar6);
          if ((int)uVar2 < 4) {
            return;
          }
        }
        uVar6 = (ulong)(uVar2 & 3) + 1;
        do {
          dy[uVar6 - 1] = *da * dx[uVar6 - 1] + dy[uVar6 - 1];
          dy[uVar6] = *da * dx[uVar6] + dy[uVar6];
          dy[uVar6 + 1] = *da * dx[uVar6 + 1] + dy[uVar6 + 1];
          dy[uVar6 + 2] = *da * dx[uVar6 + 2] + dy[uVar6 + 2];
          uVar6 = uVar6 + 4;
        } while (uVar6 <= uVar3);
        return;
      }
      iVar5 = 1 - uVar2;
      lVar9 = 1;
    }
    else {
      iVar5 = 1 - uVar2;
      iVar10 = iVar1 * iVar5 + 1;
      if (-1 < iVar1) {
        iVar10 = 1;
      }
      iVar8 = *incy;
      lVar9 = (long)iVar10;
    }
    iVar10 = 1;
    if (iVar8 < 0) {
      iVar10 = iVar5 * iVar8 + 1;
    }
    pdVar4 = dx + lVar9 + -1;
    pdVar7 = dy + (long)iVar10 + -1;
    do {
      *pdVar7 = *da * *pdVar4 + *pdVar7;
      pdVar4 = pdVar4 + iVar1;
      pdVar7 = pdVar7 + iVar8;
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void daxpy_(integer *n, doublereal *da, doublereal *dx, 
	integer *incx, doublereal *dy, integer *incy)
{


    /* System generated locals */

    /* Local variables */
    integer i, m, ix, iy, mp1;


/*     constant times a vector plus a vector.   
       uses unrolled loops for increments equal to one.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DY(I) dy[(I)-1]
#define DX(I) dx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*da == 0.) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	DY(iy) += *da * DX(ix);
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1   


          clean-up loop */

L20:
    m = *n % 4;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	DY(i) += *da * DX(i);
/* L30: */
    }
    if (*n < 4) {
	return;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 4) {
	DY(i) += *da * DX(i);
	DY(i + 1) += *da * DX(i + 1);
	DY(i + 2) += *da * DX(i + 2);
	DY(i + 3) += *da * DX(i + 3);
/* L50: */
    }
    return;
}